

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snippet.cpp
# Opt level: O2

void __thiscall cpptrace::detail::snippet_manager::build_line_table(snippet_manager *this)

{
  vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_> *this_00;
  size_type sVar1;
  size_type __pos;
  line_range local_48;
  snippet_manager *local_38;
  
  this_00 = &this->line_table;
  local_48.begin = 0;
  local_48.end = 0;
  std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
  emplace_back<cpptrace::detail::line_range>(this_00,&local_48);
  __pos = 0;
  local_38 = this;
  do {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&this->contents,'\n',__pos);
    local_48.end = sVar1;
    local_48.begin = __pos;
    if (sVar1 != 0) {
      if (sVar1 == 0xffffffffffffffff) {
        local_48.end = (local_38->contents)._M_string_length;
        std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
        emplace_back<cpptrace::detail::line_range>(this_00,&local_48);
        return;
      }
      local_48.end = sVar1 - 1;
      if ((this->contents)._M_dataplus._M_p[sVar1 - 1] != '\r') {
        local_48.end = sVar1;
      }
    }
    std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
    emplace_back<cpptrace::detail::line_range>(this_00,&local_48);
    __pos = sVar1 + 1;
  } while( true );
}

Assistant:

void build_line_table() {
            line_table.push_back({0, 0});
            std::size_t pos = 0; // stores the start of the current line
            while(true) {
                // find the end of the current line
                std::size_t terminator_pos = contents.find('\n', pos);
                if(terminator_pos == std::string::npos) {
                    line_table.push_back({pos, contents.size()});
                    break;
                } else {
                    std::size_t end_pos = terminator_pos; // one past the end of the current line
                    if(end_pos > 0 && contents[end_pos - 1] == '\r') {
                        end_pos--;
                    }
                    line_table.push_back({pos, end_pos});
                    pos = terminator_pos + 1;
                }
            }
        }